

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPack.c
# Opt level: O1

void Gia_ManLutPacking(Gia_Man_t *p,int nBlockSize,int DelayRoute,int DelayDir,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *__ptr;
  void *__s;
  void *__s_00;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  int *piVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  size_t __size;
  ulong uVar15;
  int iVar16;
  long lVar17;
  int Delays [32];
  int Perm [32];
  int local_138 [32];
  int local_b8 [34];
  int iVar3;
  
  __ptr = Gia_ManLutCollect(p);
  iVar14 = p->nObjs;
  iVar12 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar12 = iVar14;
  }
  if (iVar12 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar12 * 4);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)iVar14 * 4);
  }
  if (iVar12 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    __s_00 = malloc((long)iVar12 << 2);
  }
  if (__s_00 != (void *)0x0) {
    memset(__s_00,0,(long)iVar14 * 4);
  }
  uVar1 = __ptr->nSize;
  iVar16 = (int)(uVar1 * 2) / nBlockSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar12 = iVar16;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar12;
  uVar10 = 0;
  if (iVar12 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar12 << 2);
  }
  p_00->pArray = piVar4;
  if (0 < (int)uVar1) {
    piVar4 = __ptr->pArray;
    uVar13 = 0;
    uVar10 = 0;
    do {
      iVar12 = piVar4[uVar13];
      lVar17 = (long)iVar12;
      if (lVar17 < 0) goto LAB_0078a5a1;
      iVar16 = p->vMapping->nSize;
      if (iVar16 <= iVar12) goto LAB_0078a5a1;
      piVar5 = p->vMapping->pArray;
      lVar6 = (long)piVar5[lVar17];
      if ((lVar6 < 0) || (iVar16 <= piVar5[lVar17])) goto LAB_0078a5a1;
      iVar16 = piVar5[lVar6];
      lVar11 = (long)iVar16;
      if (0x20 < lVar11) {
        __assert_fail("nSize <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                      ,0x8a,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
      }
      if (0 < iVar16) {
        lVar7 = 0;
        do {
          iVar9 = piVar5[lVar6 + lVar7 + 1];
          if (((long)iVar9 < 0) || (iVar14 <= iVar9)) goto LAB_0078a5a1;
          local_138[lVar7] = *(int *)((long)__s + (long)iVar9 * 4);
          local_b8[lVar7] = iVar9;
          lVar7 = lVar7 + 1;
        } while (lVar11 != lVar7);
      }
      if (1 < iVar16) {
        lVar6 = 1;
        uVar8 = 0;
        do {
          uVar15 = uVar8 & 0xffffffff;
          lVar7 = lVar6;
          do {
            uVar2 = (uint)lVar7;
            if (local_138[lVar7] <= local_138[(int)(uint)uVar15]) {
              uVar2 = (uint)uVar15;
            }
            lVar7 = lVar7 + 1;
            uVar15 = (ulong)uVar2;
          } while (lVar11 != lVar7);
          iVar9 = local_b8[uVar8];
          local_b8[uVar8] = local_b8[(int)uVar2];
          iVar3 = local_138[uVar8];
          local_138[uVar8] = local_138[(int)uVar2];
          uVar8 = uVar8 + 1;
          local_b8[(int)uVar2] = iVar9;
          local_138[(int)uVar2] = iVar3;
          lVar6 = lVar6 + 1;
        } while (uVar8 != iVar16 - 1);
      }
      iVar9 = local_138[0];
      if ((1 < iVar16) && (local_138[0] < local_138[iVar16 - 1])) {
        __assert_fail("nSize < 2 || Delays[0] >= Delays[nSize-1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                      ,0x91,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
      }
      if ((local_138[0] < 0) || (local_138[lVar11 + -1] < 0)) {
        __assert_fail("Delays[0] >= 0 && Delays[nSize-1] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                      ,0x92,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
      }
      if (((long)local_b8[0] < 0) || (iVar14 <= local_b8[0])) goto LAB_0078a5a1;
      if ((local_138[0] == 0) || (local_138[0] <= local_138[1])) {
LAB_0078a19a:
        if (iVar14 <= iVar12) goto LAB_0078a5c0;
        *(int *)((long)__s_00 + lVar17 * 4) = p_00->nSize;
        Vec_IntPush(p_00,1);
        iVar3 = DelayRoute;
      }
      else {
        uVar2 = *(uint *)((long)__s_00 + (long)local_b8[0] * 4);
        if (((int)uVar2 < 0) || (p_00->nSize <= (int)uVar2)) goto LAB_0078a5a1;
        piVar5 = p_00->pArray;
        if (nBlockSize <= piVar5[uVar2]) goto LAB_0078a19a;
        if (iVar14 <= iVar12) goto LAB_0078a5c0;
        *(uint *)((long)__s_00 + lVar17 * 4) = uVar2;
        piVar5 = piVar5 + uVar2;
        *piVar5 = *piVar5 + 1;
        iVar3 = DelayDir;
      }
      uVar2 = iVar3 + iVar9;
      if (1 < iVar16) {
        lVar6 = 1;
        do {
          if ((int)uVar2 <= local_138[lVar6] + DelayRoute) {
            uVar2 = local_138[lVar6] + DelayRoute;
          }
          lVar6 = lVar6 + 1;
        } while (lVar11 != lVar6);
      }
      if (iVar14 <= iVar12) {
LAB_0078a5c0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(uint *)((long)__s + lVar17 * 4) = uVar2;
      if ((int)uVar10 <= (int)uVar2) {
        uVar10 = (ulong)uVar2;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar1);
  }
  iVar12 = p_00->nSize;
  lVar17 = (long)iVar12;
  if (lVar17 < 1) {
    uVar2 = 0;
  }
  else {
    lVar6 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 + p_00->pArray[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar17 != lVar6);
  }
  if (uVar2 != uVar1) {
    __assert_fail("Vec_IntSum(vBSize) == Vec_IntSize(vOrder)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                  ,0xa7,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
  }
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar16 = iVar12 + uVar1 + 1;
  if (iVar12 + uVar1 < 0xf) {
    iVar16 = 0x10;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar16;
  if (iVar16 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar16 << 2);
  }
  p_01->pArray = piVar4;
  Vec_IntPush(p_01,iVar12);
  p_02 = (Vec_Int_t *)malloc(0x10);
  iVar16 = 0x10;
  if (0xe < iVar12 - 1U) {
    iVar16 = iVar12;
  }
  p_02->nSize = 0;
  p_02->nCap = iVar16;
  if (iVar16 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar16 << 2);
  }
  p_02->pArray = piVar4;
  if (0 < iVar12) {
    piVar4 = p_00->pArray;
    lVar6 = 0;
    do {
      iVar12 = piVar4[lVar6];
      Vec_IntPush(p_01,iVar12);
      Vec_IntPush(p_02,p_01->nSize);
      if (0 < (long)iVar12) {
        lVar11 = (long)p_01->nSize + (long)iVar12;
        iVar12 = p_01->nCap;
        iVar16 = iVar12 * 2;
        iVar9 = (int)lVar11;
        if (iVar16 < iVar9) {
          if (iVar12 < iVar9) {
            __size = lVar11 * 4;
            if (p_01->pArray == (int *)0x0) {
              piVar5 = (int *)malloc(__size);
            }
            else {
              piVar5 = (int *)realloc(p_01->pArray,__size);
            }
            p_01->pArray = piVar5;
            iVar16 = iVar9;
LAB_0078a38f:
            if (piVar5 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            p_01->nCap = iVar16;
          }
        }
        else if (iVar12 < iVar16 && iVar12 < iVar9) {
          if (p_01->pArray == (int *)0x0) {
            piVar5 = (int *)malloc((long)iVar12 << 3);
          }
          else {
            piVar5 = (int *)realloc(p_01->pArray,(long)iVar12 << 3);
          }
          p_01->pArray = piVar5;
          goto LAB_0078a38f;
        }
        uVar2 = p_01->nSize;
        if ((int)uVar2 < iVar9) {
          memset(p_01->pArray + (int)uVar2,0xff,(ulong)(~uVar2 + iVar9) * 4 + 4);
        }
        p_01->nSize = iVar9;
      }
      lVar6 = lVar6 + 1;
    } while (lVar17 != lVar6);
  }
  if ((p_01->nCap != 0x10) && (p_01->nSize != p_01->nCap)) {
    __assert_fail("Vec_IntCap(vPacking) == 16 || Vec_IntSize(vPacking) == Vec_IntCap(vPacking)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                  ,0xb3,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
  }
  if (0 < (int)uVar1) {
    piVar4 = __ptr->pArray;
    lVar17 = (ulong)uVar1 + 1;
    do {
      iVar12 = piVar4[lVar17 + -2];
      if (((long)iVar12 < 0) || (iVar14 <= iVar12)) {
LAB_0078a5a1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar16 = *(int *)((long)__s_00 + (long)iVar12 * 4);
      lVar6 = (long)iVar16;
      if ((lVar6 < 0) || (p_02->nSize <= iVar16)) goto LAB_0078a5a1;
      piVar5 = p_02->pArray;
      iVar16 = piVar5[lVar6];
      lVar11 = (long)iVar16;
      if ((lVar11 < 0) || (p_01->nSize <= iVar16)) goto LAB_0078a5a1;
      if (p_01->pArray[lVar11] != -1) {
        __assert_fail("Vec_IntEntry(vPacking, Start) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                      ,0xb9,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
      }
      p_01->pArray[lVar11] = iVar12;
      piVar5 = piVar5 + lVar6;
      *piVar5 = *piVar5 + 1;
      lVar17 = lVar17 + -1;
    } while (1 < lVar17);
  }
  if (0 < (long)p_01->nSize) {
    lVar17 = 0;
    iVar14 = 0;
    do {
      iVar14 = iVar14 + (uint)(p_01->pArray[lVar17] == -1);
      lVar17 = lVar17 + 1;
    } while (p_01->nSize != lVar17);
    if (iVar14 != 0) {
      __assert_fail("Vec_IntCountEntry(vPacking, -1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                    ,0xbd,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
    }
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
    p_02->pArray = (int *)0x0;
  }
  free(p_02);
  if (p->vPacking != (Vec_Int_t *)0x0) {
    piVar4 = p->vPacking->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vPacking->pArray = (int *)0x0;
    }
    if (p->vPacking != (Vec_Int_t *)0x0) {
      free(p->vPacking);
      p->vPacking = (Vec_Int_t *)0x0;
    }
  }
  p->vPacking = p_01;
  printf("Global delay = %d.\n",uVar10);
  return;
}

Assistant:

void Gia_ManLutPacking( Gia_Man_t * p, int nBlockSize, int DelayRoute, int DelayDir, int fVerbose )
{
    int Delays[32], Perm[32];
    Vec_Int_t * vPacking, * vStarts;
    Vec_Int_t * vOrder = Gia_ManLutCollect( p );
    Vec_Int_t * vDelay = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vBlock = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vBSize = Vec_IntAlloc( 2 * Vec_IntSize(vOrder) / nBlockSize );
    int i, k, Id, iFan, nSize, iBlock, Delay, DelayMax = 0;
    // create blocks
    Vec_IntForEachEntry( vOrder, Id, i )
    {
        nSize = Gia_ObjLutSize( p, Id );
        assert( nSize <= 32 );
        Gia_LutForEachFanin( p, Id, iFan, k )
        {
            Delays[k] = Vec_IntEntry(vDelay, iFan);
            Perm[k] = iFan;
        }
        Vec_IntSelectSortCost2Reverse( Perm, nSize, Delays );
        assert( nSize < 2 || Delays[0] >= Delays[nSize-1] );
        assert( Delays[0] >= 0 && Delays[nSize-1] >= 0 );
        // check if we can reduce delay by adding it to the same bin as the latest one
        iBlock = Vec_IntEntry( vBlock, Perm[0] );
        if ( Delays[0] > 0 && Delays[0] > Delays[1] && Vec_IntEntry(vBSize, iBlock) < nBlockSize )
        {
            Delay = Delays[0] + DelayDir;
            Vec_IntWriteEntry( vBlock, Id, iBlock );
            Vec_IntAddToEntry( vBSize, iBlock, 1 );
        }
        else // clean new block
        {
            Delay = Delays[0] + DelayRoute;
            Vec_IntWriteEntry( vBlock, Id, Vec_IntSize(vBSize) );
            Vec_IntPush( vBSize, 1 );
        }
        // calculate delay
        for ( k = 1; k < nSize; k++ )
            Delay = Abc_MaxInt( Delay, Delays[k] + DelayRoute );
        Vec_IntWriteEntry( vDelay, Id, Delay );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    assert( Vec_IntSum(vBSize) == Vec_IntSize(vOrder) );
    // create packing info
    vPacking = Vec_IntAlloc( Vec_IntSize(vBSize) + Vec_IntSize(vOrder) + 1 );
    Vec_IntPush( vPacking, Vec_IntSize(vBSize) );
    // create starting places for each block
    vStarts = Vec_IntAlloc( Vec_IntSize(vBSize) );
    Vec_IntForEachEntry( vBSize, nSize, i )
    {
        Vec_IntPush( vPacking, nSize );
        Vec_IntPush( vStarts, Vec_IntSize(vPacking) );
        Vec_IntFillExtra( vPacking, Vec_IntSize(vPacking) + nSize, -1 );
    }
    assert( Vec_IntCap(vPacking) == 16 || Vec_IntSize(vPacking) == Vec_IntCap(vPacking) );
    // collect LUTs from the block
    Vec_IntForEachEntryReverse( vOrder, Id, i )
    {
        int Block = Vec_IntEntry( vBlock, Id );
        int Start = Vec_IntEntry( vStarts, Block );
        assert( Vec_IntEntry(vPacking, Start) == -1 );
        Vec_IntWriteEntry( vPacking, Start, Id );
        Vec_IntAddToEntry( vStarts, Block, 1 );
    }
    assert( Vec_IntCountEntry(vPacking, -1) == 0 );
    // cleanup
    Vec_IntFree( vOrder );
    Vec_IntFree( vDelay );
    Vec_IntFree( vBlock );
    Vec_IntFree( vBSize );
    Vec_IntFree( vStarts );
    Vec_IntFreeP( &p->vPacking );
    p->vPacking = vPacking;
    printf( "Global delay = %d.\n", DelayMax );
}